

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
TransformPromiseNode<kj::_::Void,_int,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++:80:34),_kj::_::PropagateException>
::getImpl(TransformPromiseNode<kj::_::Void,_int,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_test_c__:80:34),_kj::_::PropagateException>
          *this,ExceptionOrValue *output)

{
  ExceptionOr<int> depResult;
  ExceptionOr<kj::_::Void> local_598;
  NullableValue<kj::Exception> local_430;
  char local_2d0;
  int local_2cc;
  Exception local_2c8;
  Exception local_168;
  
  local_430.isSet = false;
  local_2d0 = '\0';
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,(ExceptionOrValue *)&local_430);
  if (local_430.isSet == true) {
    Exception::Exception(&local_2c8,&local_430.field_1.value);
    local_168.ownFile.content.ptr = local_2c8.ownFile.content.ptr;
    local_168.ownFile.content.size_ = local_2c8.ownFile.content.size_;
    local_168.ownFile.content.disposer = local_2c8.ownFile.content.disposer;
    local_2c8.ownFile.content.ptr = (char *)0x0;
    local_2c8.ownFile.content.size_ = 0;
    local_168.file = local_2c8.file;
    local_168.line = local_2c8.line;
    local_168.type = local_2c8.type;
    local_168.description.content.ptr = local_2c8.description.content.ptr;
    local_168.description.content.size_ = local_2c8.description.content.size_;
    local_2c8.description.content.ptr = (char *)0x0;
    local_2c8.description.content.size_ = 0;
    local_168.description.content.disposer = local_2c8.description.content.disposer;
    local_168.context.ptr.disposer = local_2c8.context.ptr.disposer;
    local_168.context.ptr.ptr = local_2c8.context.ptr.ptr;
    local_2c8.context.ptr.ptr = (Context *)0x0;
    memcpy(local_168.trace,local_2c8.trace,0x104);
    NullableValue<kj::Exception>::NullableValue
              ((NullableValue<kj::Exception> *)&local_598,&local_168);
    local_598.value.ptr.isSet = false;
    Exception::~Exception(&local_168);
    ExceptionOr<kj::_::Void>::operator=((ExceptionOr<kj::_::Void> *)output,&local_598);
    NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&local_598);
    Exception::~Exception(&local_2c8);
  }
  else if (local_2d0 == '\x01') {
    *(this->func).value = local_2cc;
    local_598.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_598.value.ptr.isSet = true;
    ExceptionOr<kj::_::Void>::operator=((ExceptionOr<kj::_::Void> *)output,&local_598);
    NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&local_598);
  }
  NullableValue<kj::Exception>::~NullableValue(&local_430);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_MAYBE(depException, depResult.exception) {
      output.as<T>() = handle(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(*depException)));
    } else KJ_IF_MAYBE(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(*depValue)));
    }
  }